

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O3

int FmsMeshFinalize(FmsMesh mesh)

{
  short sVar1;
  ushort uVar2;
  FmsIntType FVar3;
  FmsDomain pFVar4;
  size_t sVar5;
  void *pvVar6;
  FmsInt (*paFVar7) [3];
  int iVar8;
  int extraout_EAX;
  ulong uVar9;
  long lVar10;
  FmsInt *pFVar11;
  ulong uVar12;
  FmsInt *pFVar13;
  undefined1 *puVar14;
  FmsOrientation *pFVar15;
  ulong uVar16;
  FmsOrientation FVar17;
  FmsInt i;
  ulong uVar18;
  long extraout_RDX;
  long lVar19;
  FmsInt *pFVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  void *in_R8;
  FmsInt FVar25;
  byte bVar26;
  FmsInt (*in_R9) [3];
  ulong uVar27;
  char cVar28;
  long lVar29;
  uint uVar30;
  FmsInt off_2;
  FmsInt FVar31;
  FmsInt off;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  ulong uVar35;
  FmsOrientation *pFVar36;
  long lVar37;
  bool bVar38;
  FmsInt aFStack_101f8 [2041];
  undefined8 uStack_c230;
  FmsInt local_c1f8 [6143];
  code *pcStack_200;
  FmsInt FStack_1f8;
  FmsInt ei [6];
  int aiStack_198 [2];
  int nc [6];
  ulong auStack_178 [3];
  FmsInt tet_edges_sorted [4] [3];
  FmsOrientation *local_48;
  
  if (mesh == (FmsMesh)0x0) {
    iVar8 = 1;
  }
  else if (mesh->num_domains == 0) {
    iVar8 = 0;
  }
  else {
    uVar16 = 0;
    do {
      pFVar4 = mesh->domains[uVar16];
      uVar21 = pFVar4->num_entities[2];
      if (uVar21 != 0) {
        FVar3 = pFVar4->side_ids_type[2];
        if (FVar3 != pFVar4->side_ids_type[1]) {
          return 2;
        }
        sVar5 = FmsIntTypeSize[FVar3];
        pvVar6 = pFVar4->entities[1];
        in_R8 = pFVar4->entities[2];
        pFVar36 = pFVar4->orientations[2];
        uVar32 = 0;
        uVar35 = uVar21;
        do {
          FVar25 = 0x400;
          if (uVar35 < 0x400) {
            FVar25 = uVar35;
          }
          in_R9 = (FmsInt (*) [3])0x2;
          uStack_c230 = 0x10414b;
          FmsEntitiesToSides(FVar3,3,0,3,in_R8,2,pvVar6,6,0,local_c1f8,FVar25);
          iVar8 = FmsOrientFaceSides(3,FVar25,local_c1f8,pFVar36);
          if (iVar8 != 0) {
            return iVar8;
          }
          pFVar36 = pFVar36 + FVar25 * 3;
          in_R8 = (void *)((long)in_R8 + FVar25 * 3 * sVar5);
          uVar32 = uVar32 + 0x400;
          uVar35 = uVar35 - 0x400;
        } while (uVar32 < uVar21);
      }
      uVar21 = pFVar4->num_entities[3];
      if (uVar21 != 0) {
        FVar3 = pFVar4->side_ids_type[3];
        if (FVar3 != pFVar4->side_ids_type[1]) {
          return 2;
        }
        sVar5 = FmsIntTypeSize[FVar3];
        pvVar6 = pFVar4->entities[1];
        in_R8 = pFVar4->entities[3];
        pFVar36 = pFVar4->orientations[3];
        uVar32 = 0;
        uVar35 = uVar21;
        do {
          FVar25 = 0x400;
          if (uVar35 < 0x400) {
            FVar25 = uVar35;
          }
          in_R9 = (FmsInt (*) [3])0x2;
          FmsEntitiesToSides(FVar3,4,0,4,in_R8,2,pvVar6,8,0,aFStack_101f8,FVar25);
          iVar8 = FmsOrientFaceSides(4,FVar25,aFStack_101f8,pFVar36);
          if (iVar8 != 0) {
            return iVar8;
          }
          pFVar36 = pFVar36 + FVar25 * 4;
          in_R8 = (void *)((long)in_R8 + FVar25 * 4 * sVar5);
          uVar32 = uVar32 + 0x400;
          uVar35 = uVar35 - 0x400;
        } while (uVar32 < uVar21);
      }
      uVar21 = pFVar4->num_entities[4];
      if (uVar21 != 0) {
        FVar3 = pFVar4->side_ids_type[4];
        if (FVar3 != pFVar4->side_ids_type[2]) {
          return 2;
        }
        sVar5 = FmsIntTypeSize[FVar3];
        pvVar6 = pFVar4->entities[2];
        in_R8 = pFVar4->entities[4];
        pFVar36 = pFVar4->orientations[4];
        uVar35 = 0;
LAB_0010433c:
        uVar32 = uVar21 - uVar35;
        if (0x1ff < uVar32) {
          uVar32 = 0x200;
        }
        uStack_c230 = 0x104389;
        FmsEntitiesToSides(FVar3,4,0,4,in_R8,3,pvVar6,0xc,0,local_c1f8,uVar32);
        bVar38 = true;
        uVar12 = 0;
        pFVar13 = local_c1f8;
        local_48 = pFVar36;
LAB_0010439a:
        lVar23 = 0x10;
        do {
          uVar18 = *(ulong *)((long)pFVar13 + lVar23 + -0x10);
          uVar33 = *(ulong *)((long)pFVar13 + lVar23 + -8);
          uVar22 = *(ulong *)((long)pFVar13 + lVar23);
          if (uVar33 < uVar18) {
            if (uVar33 < uVar22) {
              *(ulong *)((long)auStack_178 + lVar23) = uVar33;
              if (uVar18 <= uVar22) {
                *(ulong *)((long)auStack_178 + lVar23 + 8) = uVar18;
                goto LAB_00104433;
              }
              *(ulong *)((long)auStack_178 + lVar23 + 8) = uVar22;
            }
            else {
              *(ulong *)((long)auStack_178 + lVar23) = uVar22;
              *(ulong *)((long)auStack_178 + lVar23 + 8) = uVar33;
            }
            *(ulong *)((long)tet_edges_sorted[-1] + lVar23 + 0x10) = uVar18;
          }
          else if (uVar22 < uVar33) {
            uVar9 = uVar22;
            if (uVar18 < uVar22) {
              uVar9 = uVar18;
            }
            if (uVar22 < uVar18) {
              uVar22 = uVar18;
            }
            *(ulong *)((long)auStack_178 + lVar23) = uVar9;
            *(ulong *)((long)auStack_178 + lVar23 + 8) = uVar22;
            *(ulong *)((long)tet_edges_sorted[-1] + lVar23 + 0x10) = uVar33;
          }
          else {
            *(ulong *)((long)auStack_178 + lVar23) = uVar18;
            *(ulong *)((long)auStack_178 + lVar23 + 8) = uVar33;
LAB_00104433:
            *(ulong *)((long)tet_edges_sorted[-1] + lVar23 + 0x10) = uVar22;
          }
          lVar23 = lVar23 + 0x18;
        } while (lVar23 != 0x70);
        lVar23 = 0;
LAB_00104452:
        lVar10 = (long)(int)(&DAT_001125e4)[lVar23 * 2];
        FVar25 = tet_edges_sorted[(long)(int)(&FmsOrientTetSides_tet_edge_face)[lVar23 * 2] + -1][2]
        ;
        FVar31 = tet_edges_sorted[lVar10 + -1][2];
        in_R9 = tet_edges_sorted + (int)(&FmsOrientTetSides_tet_edge_face)[lVar23 * 2];
        iVar8 = 0;
        lVar29 = 0;
        lVar37 = 0;
        do {
          while( true ) {
            if (FVar25 == FVar31) break;
            if (FVar25 < FVar31) {
              lVar29 = (long)(int)lVar29;
              do {
                if (lVar29 == 2) goto LAB_001044f6;
                FVar25 = (*in_R9)[lVar29];
                lVar29 = lVar29 + 1;
              } while (FVar25 < FVar31);
            }
            else {
              lVar37 = (long)(int)lVar37;
              do {
                if (lVar37 == 2) goto LAB_001044f6;
                FVar31 = tet_edges_sorted[lVar10][lVar37];
                lVar37 = lVar37 + 1;
              } while (FVar31 < FVar25);
            }
          }
          iVar8 = iVar8 + 1;
          ei[lVar23 + -1] = FVar25;
          lVar37 = (long)(int)lVar37;
          do {
            if (lVar37 == 2) goto LAB_001044f6;
            FVar31 = tet_edges_sorted[lVar10][lVar37];
            lVar37 = lVar37 + 1;
          } while (FVar25 == FVar31);
          lVar29 = (long)(int)lVar29;
          do {
            if (lVar29 == 2) goto LAB_001044f6;
            FVar25 = (*in_R9)[lVar29];
            lVar29 = lVar29 + 1;
          } while (FVar25 < FVar31);
        } while( true );
      }
LAB_001046f7:
      uVar35 = pFVar4->num_entities[5];
      if (uVar35 != 0) {
        FVar3 = pFVar4->side_ids_type[5];
        if (FVar3 != pFVar4->side_ids_type[3]) {
          return 2;
        }
        sVar5 = FmsIntTypeSize[FVar3];
        pvVar6 = pFVar4->entities[3];
        in_R8 = pFVar4->entities[5];
        pFVar36 = pFVar4->orientations[5];
        uVar32 = 0;
LAB_00104759:
        uVar12 = uVar35 - uVar32;
        if (0xff < uVar12) {
          uVar12 = 0x100;
        }
        uStack_c230 = 0x104795;
        FmsEntitiesToSides(FVar3,6,0,6,in_R8,4,pvVar6,0x18,0,local_c1f8,uVar12);
        uVar21 = 1;
        uVar18 = 0;
        pFVar13 = local_c1f8;
        pFVar15 = pFVar36;
LAB_001047a8:
        lVar23 = 0x18;
        do {
          uVar33 = *(ulong *)((long)pFVar13 + lVar23 + -0x18);
          uVar22 = *(ulong *)((long)pFVar13 + lVar23 + -0x10);
          uVar9 = uVar22;
          if (uVar33 >= uVar22 && uVar33 != uVar22) {
            uVar9 = uVar33;
          }
          if (uVar33 < uVar22) {
            uVar22 = uVar33;
          }
          uVar33 = *(ulong *)((long)pFVar13 + lVar23 + -8);
          uVar24 = *(ulong *)((long)pFVar13 + lVar23);
          uVar27 = uVar24;
          if (uVar33 < uVar24) {
            uVar27 = uVar33;
          }
          if (uVar24 < uVar33) {
            uVar24 = uVar33;
          }
          if (uVar27 < uVar22) {
            *(ulong *)((long)nc + lVar23 + 0x10) = uVar27;
            if (uVar22 < uVar24) {
              *(ulong *)((long)auStack_178 + lVar23) = uVar22;
              if (uVar24 <= uVar9) goto LAB_00104823;
LAB_001047ff:
              *(ulong *)((long)auStack_178 + lVar23 + 8) = uVar9;
              uVar9 = uVar24;
            }
            else {
              *(ulong *)((long)auStack_178 + lVar23) = uVar24;
              *(ulong *)((long)auStack_178 + lVar23 + 8) = uVar22;
            }
          }
          else {
            *(ulong *)((long)nc + lVar23 + 0x10) = uVar22;
            if (uVar27 < uVar9) {
              *(ulong *)((long)auStack_178 + lVar23) = uVar27;
              if (uVar9 <= uVar24) goto LAB_001047ff;
LAB_00104823:
              *(ulong *)((long)auStack_178 + lVar23 + 8) = uVar24;
            }
            else {
              *(ulong *)((long)auStack_178 + lVar23) = uVar9;
              *(ulong *)((long)auStack_178 + lVar23 + 8) = uVar27;
              uVar9 = uVar24;
            }
          }
          *(ulong *)((long)tet_edges_sorted[-1] + lVar23 + 0x10) = uVar9;
          lVar23 = lVar23 + 0x20;
        } while (lVar23 != 0xd8);
        lVar23 = 0;
LAB_0010486d:
        uVar33 = *(ulong *)((long)tet_edges_sorted +
                           (long)(int)(&FmsOrientHexSides_hex_edge_face)[lVar23 * 2] * 0x20 + -8);
        uVar22 = *(ulong *)((long)tet_edges_sorted +
                           (long)(int)(&DAT_00112654)[lVar23 * 2] * 0x20 + -8);
        lVar10 = (long)(int)(&DAT_00112654)[lVar23 * 2] * 0x20 + -0x160;
        in_R9 = (FmsInt (*) [3])
                ((long)tet_edges_sorted +
                (long)(int)(&FmsOrientHexSides_hex_edge_face)[lVar23 * 2] * 0x20);
        iVar8 = 0;
        lVar29 = 0;
        lVar37 = 0;
        do {
          while( true ) {
            if (uVar33 == uVar22) break;
            if (uVar33 < uVar22) {
              lVar29 = (long)(int)lVar29;
              do {
                if (lVar29 == 3) goto LAB_00104910;
                uVar33 = (*in_R9)[lVar29];
                lVar29 = lVar29 + 1;
              } while (uVar33 < uVar22);
            }
            else {
              lVar37 = (long)(int)lVar37;
              do {
                if (lVar37 == 3) goto LAB_00104910;
                uVar22 = *(ulong *)((long)tet_edges_sorted + lVar37 * 8 + lVar10 + 0x160);
                lVar37 = lVar37 + 1;
              } while (uVar22 < uVar33);
            }
          }
          iVar8 = iVar8 + 1;
          ei[lVar23 + -1] = uVar33;
          lVar37 = (long)(int)lVar37;
          do {
            if (lVar37 == 3) goto LAB_00104910;
            uVar22 = *(ulong *)((long)tet_edges_sorted + lVar37 * 8 + lVar10 + 0x160);
            lVar37 = lVar37 + 1;
          } while (uVar33 == uVar22);
          lVar29 = (long)(int)lVar29;
          do {
            if (lVar29 == 3) goto LAB_00104910;
            uVar33 = (*in_R9)[lVar29];
            lVar29 = lVar29 + 1;
          } while (uVar33 < uVar22);
        } while( true );
      }
LAB_00104aa1:
      if (pFVar4->num_entities[6] != 0) {
        pcStack_200 = (code *)0x104af1;
        FmsMeshFinalize_cold_1();
LAB_00104af1:
        uVar30 = (uint)mesh;
        pcStack_200 = FmsEntitiesToSides;
        FmsMeshFinalize_cold_2();
        iVar8 = extraout_EAX;
        if (uVar30 < 8) {
          lVar23 = ei[3] + ei[2] * 8;
          uVar35 = ei[4];
          switch(uVar30) {
          case 0:
            if (ei[4] != 0) {
              FVar25 = 0;
              do {
                if (uVar16 != 0) {
                  uVar32 = 0;
                  lVar10 = lVar23;
                  do {
                    if (in_R9 != (FmsInt (*) [3])0x0) {
                      cVar28 = *(char *)((long)in_R8 + uVar32 + FVar25 * uVar21 + extraout_RDX);
                      lVar29 = 0;
                      do {
                        uVar35 = (ulong)*(char *)(lVar29 + (long)cVar28 * (long)in_R9 + ei[0]);
                        *(ulong *)(lVar10 + lVar29 * 8) = uVar35;
                        lVar29 = lVar29 + 1;
                      } while (in_R9 != (FmsInt (*) [3])lVar29);
                    }
                    uVar32 = uVar32 + 1;
                    lVar10 = lVar10 + (long)in_R9 * 8;
                  } while (uVar32 != uVar16);
                }
                FVar25 = FVar25 + 1;
                lVar23 = lVar23 + ei[1] * 8;
              } while (FVar25 != ei[4]);
            }
            break;
          case 1:
            if (ei[4] != 0) {
              FVar25 = 0;
              do {
                if (uVar16 != 0) {
                  uVar35 = FVar25 * uVar21;
                  lVar10 = uVar35 * 2;
                  uVar32 = 0;
                  lVar29 = lVar23;
                  do {
                    if (in_R9 != (FmsInt (*) [3])0x0) {
                      sVar1 = *(short *)((long)in_R8 + uVar32 * 2 + lVar10 + extraout_RDX * 2);
                      lVar37 = 0;
                      do {
                        uVar35 = (ulong)*(short *)(ei[0] + (long)sVar1 * (long)in_R9 * 2 +
                                                  lVar37 * 2);
                        *(ulong *)(lVar29 + lVar37 * 8) = uVar35;
                        lVar37 = lVar37 + 1;
                      } while (in_R9 != (FmsInt (*) [3])lVar37);
                    }
                    uVar32 = uVar32 + 1;
                    lVar29 = lVar29 + (long)in_R9 * 8;
                  } while (uVar32 != uVar16);
                }
                FVar25 = FVar25 + 1;
                lVar23 = lVar23 + ei[1] * 8;
              } while (FVar25 != ei[4]);
            }
            break;
          case 2:
            if (ei[4] != 0) {
              FVar25 = 0;
              do {
                if (uVar16 != 0) {
                  uVar35 = FVar25 * uVar21;
                  lVar10 = uVar35 * 4;
                  uVar32 = 0;
                  lVar29 = lVar23;
                  do {
                    if (in_R9 != (FmsInt (*) [3])0x0) {
                      iVar8 = *(int *)((long)in_R8 + uVar32 * 4 + lVar10 + extraout_RDX * 4);
                      lVar37 = 0;
                      do {
                        uVar35 = (ulong)*(int *)(ei[0] + (long)iVar8 * (long)in_R9 * 4 + lVar37 * 4)
                        ;
                        *(ulong *)(lVar29 + lVar37 * 8) = uVar35;
                        lVar37 = lVar37 + 1;
                      } while (in_R9 != (FmsInt (*) [3])lVar37);
                    }
                    uVar32 = uVar32 + 1;
                    lVar29 = lVar29 + (long)in_R9 * 8;
                  } while (uVar32 != uVar16);
                }
                FVar25 = FVar25 + 1;
                lVar23 = lVar23 + ei[1] * 8;
              } while (FVar25 != ei[4]);
            }
            break;
          case 3:
            if (ei[4] != 0) {
              FVar25 = 0;
              do {
                if (uVar16 != 0) {
                  uVar35 = FVar25 * uVar21;
                  lVar10 = uVar35 * 8;
                  uVar32 = 0;
                  lVar29 = lVar23;
                  do {
                    if (in_R9 != (FmsInt (*) [3])0x0) {
                      lVar37 = *(long *)((long)in_R8 + uVar32 * 8 + lVar10 + extraout_RDX * 8);
                      lVar19 = 0;
                      do {
                        uVar35 = *(ulong *)(ei[0] + lVar37 * (long)in_R9 * 8 + lVar19 * 8);
                        *(ulong *)(lVar29 + lVar19 * 8) = uVar35;
                        lVar19 = lVar19 + 1;
                      } while (in_R9 != (FmsInt (*) [3])lVar19);
                    }
                    uVar32 = uVar32 + 1;
                    lVar29 = lVar29 + (long)in_R9 * 8;
                  } while (uVar32 != uVar16);
                }
                FVar25 = FVar25 + 1;
                lVar23 = lVar23 + ei[1] * 8;
              } while (FVar25 != ei[4]);
            }
            break;
          case 4:
            if (ei[4] != 0) {
              FVar25 = 0;
              do {
                if (uVar16 != 0) {
                  uVar32 = 0;
                  lVar10 = lVar23;
                  do {
                    if (in_R9 != (FmsInt (*) [3])0x0) {
                      bVar26 = *(byte *)((long)in_R8 + uVar32 + FVar25 * uVar21 + extraout_RDX);
                      lVar29 = 0;
                      do {
                        uVar35 = (ulong)*(byte *)(lVar29 + (ulong)bVar26 * (long)in_R9 + ei[0]);
                        *(ulong *)(lVar10 + lVar29 * 8) = uVar35;
                        lVar29 = lVar29 + 1;
                      } while (in_R9 != (FmsInt (*) [3])lVar29);
                    }
                    uVar32 = uVar32 + 1;
                    lVar10 = lVar10 + (long)in_R9 * 8;
                  } while (uVar32 != uVar16);
                }
                FVar25 = FVar25 + 1;
                lVar23 = lVar23 + ei[1] * 8;
              } while (FVar25 != ei[4]);
            }
            break;
          case 5:
            if (ei[4] != 0) {
              FVar25 = 0;
              do {
                if (uVar16 != 0) {
                  uVar35 = FVar25 * uVar21;
                  lVar10 = uVar35 * 2;
                  uVar32 = 0;
                  lVar29 = lVar23;
                  do {
                    if (in_R9 != (FmsInt (*) [3])0x0) {
                      uVar2 = *(ushort *)((long)in_R8 + uVar32 * 2 + lVar10 + extraout_RDX * 2);
                      lVar37 = 0;
                      do {
                        uVar35 = (ulong)*(ushort *)
                                         (ei[0] + (ulong)uVar2 * (long)in_R9 * 2 + lVar37 * 2);
                        *(ulong *)(lVar29 + lVar37 * 8) = uVar35;
                        lVar37 = lVar37 + 1;
                      } while (in_R9 != (FmsInt (*) [3])lVar37);
                    }
                    uVar32 = uVar32 + 1;
                    lVar29 = lVar29 + (long)in_R9 * 8;
                  } while (uVar32 != uVar16);
                }
                FVar25 = FVar25 + 1;
                lVar23 = lVar23 + ei[1] * 8;
              } while (FVar25 != ei[4]);
            }
            break;
          case 6:
            if (ei[4] != 0) {
              FVar25 = 0;
              do {
                if (uVar16 != 0) {
                  uVar35 = FVar25 * uVar21;
                  lVar10 = uVar35 * 4;
                  uVar32 = 0;
                  lVar29 = lVar23;
                  do {
                    if (in_R9 != (FmsInt (*) [3])0x0) {
                      uVar30 = *(uint *)((long)in_R8 + uVar32 * 4 + lVar10 + extraout_RDX * 4);
                      lVar37 = 0;
                      do {
                        uVar35 = (ulong)*(uint *)(ei[0] + (ulong)uVar30 * (long)in_R9 * 4 +
                                                 lVar37 * 4);
                        *(ulong *)(lVar29 + lVar37 * 8) = uVar35;
                        lVar37 = lVar37 + 1;
                      } while (in_R9 != (FmsInt (*) [3])lVar37);
                    }
                    uVar32 = uVar32 + 1;
                    lVar29 = lVar29 + (long)in_R9 * 8;
                  } while (uVar32 != uVar16);
                }
                FVar25 = FVar25 + 1;
                lVar23 = lVar23 + ei[1] * 8;
              } while (FVar25 != ei[4]);
            }
            break;
          case 7:
            if (ei[4] != 0) {
              FVar25 = 0;
              do {
                if (uVar16 != 0) {
                  uVar35 = FVar25 * uVar21;
                  lVar10 = uVar35 * 8;
                  uVar32 = 0;
                  lVar29 = lVar23;
                  do {
                    if (in_R9 != (FmsInt (*) [3])0x0) {
                      lVar37 = *(long *)((long)in_R8 + uVar32 * 8 + lVar10 + extraout_RDX * 8);
                      lVar19 = 0;
                      do {
                        uVar35 = *(ulong *)(ei[0] + lVar37 * (long)in_R9 * 8 + lVar19 * 8);
                        *(ulong *)(lVar29 + lVar19 * 8) = uVar35;
                        lVar19 = lVar19 + 1;
                      } while (in_R9 != (FmsInt (*) [3])lVar19);
                    }
                    uVar32 = uVar32 + 1;
                    lVar29 = lVar29 + (long)in_R9 * 8;
                  } while (uVar32 != uVar16);
                }
                FVar25 = FVar25 + 1;
                lVar23 = lVar23 + ei[1] * 8;
              } while (FVar25 != ei[4]);
            }
          }
          iVar8 = (int)uVar35;
        }
        return iVar8;
      }
      if (pFVar4->num_entities[7] != 0) goto LAB_00104af1;
      uVar16 = uVar16 + 1;
      iVar8 = 0;
    } while (uVar16 < mesh->num_domains);
  }
  return iVar8;
LAB_001044f6:
  aiStack_198[lVar23] = iVar8;
  if (iVar8 == 0) {
    if (bVar38) {
      return 1;
    }
    goto LAB_0010469c;
  }
  lVar23 = lVar23 + 1;
  if (lVar23 == 6) goto code_r0x00104514;
  goto LAB_00104452;
code_r0x00104514:
  lVar23 = 0;
  pFVar11 = pFVar13;
  do {
    in_R9 = (FmsInt (*) [3])pFVar13[lVar23 * 3];
    if ((in_R9 != (FmsInt (*) [3])pFVar13[lVar23 * 3 + 1]) &&
       (paFVar7 = (FmsInt (*) [3])pFVar13[lVar23 * 3 + 2], bVar38 = in_R9 == paFVar7,
       in_R9 = (FmsInt (*) [3])CONCAT71((int7)((ulong)in_R9 >> 8),bVar38),
       (FmsInt (*) [3])pFVar13[lVar23 * 3 + 1] != paFVar7 && !bVar38)) {
      in_R9 = (FmsInt (*) [3])ei[(long)(int)(&DAT_00112618)[lVar23 * 3] + -1];
      if (aiStack_198[(int)(&FmsOrientTetSides_tet_face_edge)[lVar23 * 3]] == 1) {
        cVar28 = -2;
        uVar30 = 0;
        uVar34 = 1;
        pFVar20 = pFVar11;
        do {
          cVar28 = cVar28 + '\x02';
          uVar30 = uVar30 + 1;
          uVar34 = uVar34 + 1;
          FVar25 = *pFVar20;
          pFVar20 = pFVar20 + 1;
        } while (ei[(long)(int)(&FmsOrientTetSides_tet_face_edge)[lVar23 * 3] + -1] != FVar25);
        if (aiStack_198[(int)(&DAT_00112614)[lVar23 * 3]] == 1) {
          bVar38 = pFVar13[lVar23 * 3 + (ulong)(uVar30 % 3)] ==
                   ei[(long)(int)(&DAT_00112614)[lVar23 * 3] + -1];
        }
        else {
          if (aiStack_198[(int)(&DAT_00112618)[lVar23 * 3]] != 1) goto LAB_0010465a;
          bVar38 = (FmsInt (*) [3])pFVar13[lVar23 * 3 + (ulong)(uVar34 % 3)] == in_R9;
        }
        FVar17 = !bVar38 + cVar28;
      }
      else {
        if ((aiStack_198[(int)(&DAT_00112614)[lVar23 * 3]] != 1) ||
           (aiStack_198[(int)(&DAT_00112618)[lVar23 * 3]] != 1)) goto LAB_0010465a;
        uVar18 = 0;
        do {
          uVar33 = uVar18;
          uVar18 = uVar33 + 1;
        } while (ei[(long)(int)(&DAT_00112614)[lVar23 * 3] + -1] != pFVar11[uVar33]);
        puVar14 = &GetTriangleOrientation_oo_24;
        if ((FmsInt (*) [3])
            pFVar13[lVar23 * 3 + (ulong)(uint)((int)uVar18 + (int)((uVar18 & 0xffffffff) / 3) * -3)]
            == in_R9) {
          puVar14 = &GetTriangleOrientation_oo;
        }
        FVar17 = puVar14[uVar33];
      }
      if (FVar17 != 0xff) {
        local_48[lVar23] = FVar17;
      }
    }
LAB_0010465a:
    lVar23 = lVar23 + 1;
    pFVar11 = pFVar11 + 3;
  } while (lVar23 != 4);
  pFVar13 = pFVar13 + 0xc;
  local_48 = local_48 + 4;
  uVar12 = uVar12 + 1;
  bVar38 = uVar12 < uVar32;
  if (uVar12 == uVar32) goto LAB_0010469c;
  goto LAB_0010439a;
LAB_0010469c:
  pFVar36 = pFVar36 + uVar32 * 4;
  in_R8 = (void *)((long)in_R8 + uVar32 * 4 * sVar5);
  uVar35 = uVar35 + 0x200;
  if (uVar21 <= uVar35) goto LAB_001046f7;
  goto LAB_0010433c;
LAB_00104910:
  aiStack_198[lVar23] = iVar8;
  if (iVar8 == 0) {
    uVar18 = uVar21 & 1;
    uVar21 = uVar22;
    if (uVar18 != 0) {
      return 1;
    }
    goto LAB_00104a55;
  }
  lVar23 = lVar23 + 1;
  if (lVar23 == 0xc) goto code_r0x0010492e;
  goto LAB_0010486d;
code_r0x0010492e:
  lVar23 = 0;
  pFVar11 = pFVar13;
  do {
    lVar10 = lVar23 * 0x20;
    in_R9 = *(FmsInt (**) [3])((long)tet_edges_sorted + lVar10);
    if (((*(FmsInt (**) [3])((long)tet_edges_sorted + lVar10 + -8) != in_R9) &&
        (paFVar7 = *(FmsInt (**) [3])((long)tet_edges_sorted + lVar10 + 8), in_R9 != paFVar7)) &&
       (paFVar7 != *(FmsInt (**) [3])((long)tet_edges_sorted + lVar10 + 0x10))) {
      lVar10 = lVar23 * 0x10;
      in_R9 = (FmsInt (*) [3])(long)*(int *)(FmsOrientHexSides_hex_face_edge + lVar10);
      if (((aiStack_198[(long)in_R9] == 1) &&
          (aiStack_198[*(int *)(FmsOrientHexSides_hex_face_edge + lVar10 + 4)] == 1)) &&
         ((aiStack_198[*(int *)(FmsOrientHexSides_hex_face_edge + lVar10 + 8)] == 1 &&
          (aiStack_198[*(int *)(FmsOrientHexSides_hex_face_edge + lVar10 + 0xc)] == 1)))) {
        paFVar7 = in_R9 + -1;
        in_R9 = (FmsInt (*) [3])0x0;
        lVar29 = 0;
        do {
          lVar37 = lVar29 + 1;
          bVar26 = (char)in_R9 - 2;
          in_R9 = (FmsInt (*) [3])(ulong)bVar26;
          pFVar20 = pFVar11 + lVar29;
          lVar29 = lVar37;
        } while (*pFVar20 != ei[(long)((long)*paFVar7 + 0x17)]);
        if ((byte)((pFVar13[lVar23 * 4 + (ulong)((uint)lVar37 & 3)] !=
                   ei[(long)*(int *)(FmsOrientHexSides_hex_face_edge + lVar10 + 4) + -1]) - 1U) !=
            bVar26) {
          pFVar15[lVar23] =
               ((pFVar13[lVar23 * 4 + (ulong)((uint)lVar37 & 3)] !=
                ei[(long)*(int *)(FmsOrientHexSides_hex_face_edge + lVar10 + 4) + -1]) - bVar26) +
               0xfe;
        }
      }
    }
    lVar23 = lVar23 + 1;
    pFVar11 = pFVar11 + 4;
  } while (lVar23 != 6);
  pFVar13 = pFVar13 + 0x18;
  pFVar15 = pFVar15 + 6;
  uVar18 = uVar18 + 1;
  uVar21 = CONCAT71((int7)((ulong)pFVar11 >> 8),uVar18 < uVar12);
  if (uVar18 == uVar12) goto LAB_00104a55;
  goto LAB_001047a8;
LAB_00104a55:
  pFVar36 = pFVar36 + uVar12 * 6;
  in_R8 = (void *)((long)in_R8 + uVar12 * 6 * sVar5);
  uVar32 = uVar32 + 0x100;
  if (uVar35 <= uVar32) goto LAB_00104aa1;
  goto LAB_00104759;
}

Assistant:

int FmsMeshFinalize(FmsMesh mesh) {
  if (!mesh) { E_RETURN(1); }
  // Generate the side entity orientations for all entities in all domains
  for (FmsInt domain_id = 0; domain_id < mesh->num_domains; domain_id++) {
    FmsDomain domain = mesh->domains[domain_id];
    // Triangles
    if (domain->num_entities[FMS_TRIANGLE]) {
      const FmsEntityType et = FMS_TRIANGLE;
      const FmsIntType side_ids_type = domain->side_ids_type[et];
      if (side_ids_type != domain->side_ids_type[FMS_EDGE]) { E_RETURN(2); }
      const size_t sizeof_side_ids = FmsIntTypeSize[side_ids_type];
      const FmsInt num_tri = domain->num_entities[et];
      const char *all_tris = domain->entities[et];
      const void *all_edges = domain->entities[FMS_EDGE];
      FmsOrientation *oris = domain->orientations[et];
      const int bsize = 1024;
      FmsInt tri_verts[6*bsize];
      for (FmsInt off = 0; off < num_tri; off += bsize) {
        const FmsInt sz = FmsIntMin(bsize, num_tri-off);
        FmsEntitiesToSides(side_ids_type, 3, 0, 3, all_tris, 2, all_edges,
                           6, 0, tri_verts, sz);
        int err = FmsOrientFaceSides(3, sz, tri_verts, oris);
        if (err) { E_RETURN(err); }
        // TODO: create/update a list of the unknown side orientations
        all_tris += 3*sz*sizeof_side_ids;
        oris += 3*sz;
      }
    }
    // Quads
    if (domain->num_entities[FMS_QUADRILATERAL]) {
      const FmsEntityType et = FMS_QUADRILATERAL;
      const FmsIntType side_ids_type = domain->side_ids_type[et];
      if (side_ids_type != domain->side_ids_type[FMS_EDGE]) { E_RETURN(2); }
      const size_t sizeof_side_ids = FmsIntTypeSize[side_ids_type];
      const FmsInt num_quads = domain->num_entities[et];
      const char *all_quads = domain->entities[et];
      const void *all_edges = domain->entities[FMS_EDGE];
      FmsOrientation *oris = domain->orientations[et];
      const int bsize = 1024;
      FmsInt quad_verts[8*bsize];
      for (FmsInt off = 0; off < num_quads; off += bsize) {
        const FmsInt sz = FmsIntMin(bsize, num_quads-off);
        FmsEntitiesToSides(side_ids_type, 4, 0, 4, all_quads, 2, all_edges,
                           8, 0, quad_verts, sz);
        int err = FmsOrientFaceSides(4, sz, quad_verts, oris);
        if (err) { E_RETURN(err); }
        // TODO: create/update a list of the unknown side orientations
        all_quads += 4*sz*sizeof_side_ids;
        oris += 4*sz;
      }
    }
    // Tets
    if (domain->num_entities[FMS_TETRAHEDRON]) {
      const FmsEntityType et = FMS_TETRAHEDRON;
      const FmsIntType side_ids_type = domain->side_ids_type[et];
      if (side_ids_type != domain->side_ids_type[FMS_TRIANGLE]) { E_RETURN(2); }
      const size_t sizeof_side_ids = FmsIntTypeSize[side_ids_type];
      const FmsInt num_tets = domain->num_entities[et];
      const char *all_tets = domain->entities[et];
      const void *all_tris = domain->entities[FMS_TRIANGLE];
      FmsOrientation *oris = domain->orientations[et];
      const int bsize = 512;
      FmsInt tet_edges[12*bsize];
      for (FmsInt off = 0; off < num_tets; off += bsize) {
        const FmsInt sz = FmsIntMin(bsize, num_tets-off);
        FmsEntitiesToSides(side_ids_type, 4, 0, 4, all_tets, 3, all_tris,
                           12, 0, tet_edges, sz);
        int err = FmsOrientTetSides(sz, tet_edges, oris);
        if (err) { E_RETURN(err); }
        // TODO: create/update a list of the unknown side orientations
        all_tets += 4*sz*sizeof_side_ids;
        oris += 4*sz;
      }
    }
    // Hexes
    if (domain->num_entities[FMS_HEXAHEDRON]) {
      const FmsEntityType et = FMS_HEXAHEDRON;
      const FmsIntType side_ids_type = domain->side_ids_type[et];
      if (side_ids_type != domain->side_ids_type[FMS_QUADRILATERAL]) {
        E_RETURN(2);
      }
      const size_t sizeof_side_ids = FmsIntTypeSize[side_ids_type];
      const FmsInt num_hexes = domain->num_entities[et];
      const char *all_hexes = domain->entities[et];
      const void *all_quads = domain->entities[FMS_QUADRILATERAL];
      FmsOrientation *oris = domain->orientations[et];
      const int bsize = 256;
      FmsInt hex_edges[24*bsize];
      for (FmsInt off = 0; off < num_hexes; off += bsize) {
        const FmsInt sz = FmsIntMin(bsize, num_hexes-off);
        FmsEntitiesToSides(side_ids_type, 6, 0, 6, all_hexes, 4, all_quads,
                           24, 0, hex_edges, sz);
        int err = FmsOrientHexSides(sz, hex_edges, oris);
        if (err) { E_RETURN(err); }
        // TODO: create/update a list of the unknown side orientations
        all_hexes += 6*sz*sizeof_side_ids;
        oris += 6*sz;
      }
    }
    // Wedges
    if (domain->num_entities[FMS_WEDGE]) {
      // TODO ...
      FmsAbortNotImplemented();
    }
    // Pyramids
    if (domain->num_entities[FMS_PYRAMID]) {
      // TODO ...
      FmsAbortNotImplemented();
    }
  }
  // TODO ...
  return 0;
}